

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

void uECC_vli_modMult(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,uECC_word_t *mod,
                     wordcount_t num_words)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  char cVar8;
  int iVar9;
  undefined7 in_register_00000081;
  long lVar10;
  ulong uVar11;
  uECC_word_t auStack_4f8 [124];
  uECC_word_t *local_118 [4];
  uECC_word_t mod_multiple [8];
  uECC_word_t product [8];
  uECC_word_t tmp [8];
  
  iVar9 = (int)CONCAT71(in_register_00000081,num_words);
  local_118[3] = result;
  uECC_vli_mult(product,left,right,num_words);
  local_118[0] = tmp;
  local_118[1] = product;
  uVar4 = uECC_vli_numBits(mod,num_words);
  uVar7 = iVar9 * 0x80 - (uint)uVar4;
  uVar1 = (uint)(ushort)((short)uVar7 >> 0xf) << 0x10 | uVar7 & 0xffff;
  iVar2 = (int)uVar1 % 0x40;
  bVar3 = (byte)iVar2;
  cVar8 = (char)((int)uVar1 / 0x40);
  uECC_vli_clear(mod_multiple,cVar8);
  if ((short)iVar2 < 1) {
    uECC_vli_set(mod_multiple + cVar8,mod,num_words);
  }
  else {
    uVar5 = 0;
    for (lVar10 = 0; num_words != lVar10; lVar10 = lVar10 + 1) {
      uVar6 = mod[lVar10];
      mod_multiple[cVar8 + lVar10] = uVar6 << (bVar3 & 0x3f) | uVar5;
      uVar5 = uVar6 >> (0x40 - bVar3 & 0x3f);
    }
  }
  uVar5 = 1;
  for (; -1 < (short)uVar7; uVar7 = uVar7 - 1) {
    uVar6 = 0;
    for (cVar8 = '\0'; (int)cVar8 < iVar9 * 2; cVar8 = cVar8 + '\x01') {
      uVar11 = mod_multiple[cVar8] + uVar6;
      if (uVar11 != 0) {
        uVar6 = (ulong)(local_118[uVar5][cVar8] < uVar11);
      }
      local_118[uVar5 ^ 1][cVar8] = local_118[uVar5][cVar8] - uVar11;
    }
    uVar5 = (ulong)(uVar5 == uVar6);
    uECC_vli_rshift1(mod_multiple,num_words);
    mod_multiple[iVar9 + -1] = mod_multiple[iVar9 + -1] | mod_multiple[num_words] << 0x3f;
    uECC_vli_rshift1(mod_multiple + num_words,num_words);
  }
  uECC_vli_set(local_118[3],local_118[uVar5],num_words);
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_modMult(uECC_word_t *result,
                                   const uECC_word_t *left,
                                   const uECC_word_t *right,
                                   const uECC_word_t *mod,
                                   wordcount_t num_words) {
    uECC_word_t product[2 * uECC_MAX_WORDS];
    uECC_vli_mult(product, left, right, num_words);
    uECC_vli_mmod(result, product, mod, num_words);
}